

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O0

bool google::ParseCtorDtorName(State *state)

{
  int length;
  char *str;
  bool bVar1;
  int prev_name_length_1;
  char *prev_name_1;
  int prev_name_length;
  char *prev_name;
  State copy;
  State *state_local;
  
  copy._40_8_ = state;
  memcpy(&prev_name,state,0x30);
  bVar1 = ParseOneCharToken((State *)copy._40_8_,'C');
  if ((bVar1) && (bVar1 = ParseCharClass((State *)copy._40_8_,"123"), bVar1)) {
    MaybeAppendWithLength
              ((State *)copy._40_8_,*(char **)(copy._40_8_ + 0x20),*(int *)(copy._40_8_ + 0x28));
    state_local._7_1_ = true;
  }
  else {
    memcpy((void *)copy._40_8_,&prev_name,0x30);
    bVar1 = ParseOneCharToken((State *)copy._40_8_,'D');
    if ((bVar1) && (bVar1 = ParseCharClass((State *)copy._40_8_,"012"), bVar1)) {
      str = *(char **)(copy._40_8_ + 0x20);
      length = *(int *)(copy._40_8_ + 0x28);
      MaybeAppend((State *)copy._40_8_,"~");
      MaybeAppendWithLength((State *)copy._40_8_,str,length);
      state_local._7_1_ = true;
    }
    else {
      memcpy((void *)copy._40_8_,&prev_name,0x30);
      state_local._7_1_ = false;
    }
  }
  return state_local._7_1_;
}

Assistant:

static bool ParseCtorDtorName(State *state) {
  State copy = *state;
  if (ParseOneCharToken(state, 'C') &&
      ParseCharClass(state, "123")) {
    const char * const prev_name = state->prev_name;
    const int prev_name_length = state->prev_name_length;
    MaybeAppendWithLength(state, prev_name, prev_name_length);
    return true;
  }
  *state = copy;

  if (ParseOneCharToken(state, 'D') &&
      ParseCharClass(state, "012")) {
    const char * const prev_name = state->prev_name;
    const int prev_name_length = state->prev_name_length;
    MaybeAppend(state, "~");
    MaybeAppendWithLength(state, prev_name, prev_name_length);
    return true;
  }
  *state = copy;
  return false;
}